

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

string * __thiscall
duckdb::UUIDStatsUnifier::StatsToString
          (string *__return_storage_ptr__,UUIDStatsUnifier *this,string *stats)

{
  uint uVar1;
  idx_t i;
  long lVar2;
  
  if (stats->_M_string_length == 0x10) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      uVar1 = (uint)lVar2 & 0xd;
      if ((uVar1 == 8) || (uVar1 == 4)) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

string StatsToString(const string &stats) override {
		if (stats.size() != 16) {
			return string();
		}
		auto data_ptr = const_data_ptr_cast(stats.c_str());
		static char const UUID_DIGITS[] = "0123456789abcdef";
		string result;
		// UUID format is XXXXXXXX-XXXX-XXXX-XXXX-XXXXXXXX
		// i.e. dashes are at bytes 4, 6, 8, 10
		for (idx_t i = 0; i < 16; i++) {
			if (i == 4 || i == 6 || i == 8 || i == 10) {
				result += "-";
			}
			result += UUID_DIGITS[data_ptr[i] >> 4];
			result += UUID_DIGITS[data_ptr[i] & 0xf];
		}
		return result;
	}